

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int readMasterJournal(sqlite3_file *pJrnl,char *zMaster,u32 nMaster)

{
  long local_48;
  uchar aMagic [8];
  u32 u;
  u32 cksum;
  i64 szJ;
  int local_28;
  u32 len;
  int rc;
  u32 nMaster_local;
  char *zMaster_local;
  sqlite3_file *pJrnl_local;
  
  *zMaster = '\0';
  len = nMaster;
  _rc = zMaster;
  zMaster_local = (char *)pJrnl;
  local_28 = sqlite3OsFileSize(pJrnl,(i64 *)&u);
  if ((((((local_28 == 0) && (0xf < _u)) &&
        (local_28 = read32bits((sqlite3_file *)zMaster_local,_u + -0x10,(u32 *)((long)&szJ + 4)),
        local_28 == 0)) && ((szJ._4_4_ < len && ((long)(ulong)szJ._4_4_ <= _u + -0x10)))) &&
      ((szJ._4_4_ != 0 &&
       ((local_28 = read32bits((sqlite3_file *)zMaster_local,_u + -0xc,(u32 *)(aMagic + 4)),
        local_28 == 0 &&
        (local_28 = sqlite3OsRead((sqlite3_file *)zMaster_local,&local_48,8,_u + -8), local_28 == 0)
        ))))) &&
     ((local_48 == -0x289c5edf06fa2a27 &&
      (local_28 = sqlite3OsRead((sqlite3_file *)zMaster_local,_rc,szJ._4_4_,
                                (_u + -0x10) - (ulong)szJ._4_4_), local_28 == 0)))) {
    aMagic[0] = '\0';
    aMagic[1] = '\0';
    aMagic[2] = '\0';
    aMagic[3] = '\0';
    for (; (uint)aMagic._0_4_ < szJ._4_4_; aMagic._0_4_ = aMagic._0_4_ + 1) {
      aMagic._4_4_ = aMagic._4_4_ - (int)_rc[(uint)aMagic._0_4_];
    }
    if (aMagic._4_4_ != 0) {
      szJ._4_4_ = 0;
    }
    _rc[szJ._4_4_] = '\0';
    return 0;
  }
  return local_28;
}

Assistant:

static int readMasterJournal(sqlite3_file *pJrnl, char *zMaster, u32 nMaster){
  int rc;                    /* Return code */
  u32 len;                   /* Length in bytes of master journal name */
  i64 szJ;                   /* Total size in bytes of journal file pJrnl */
  u32 cksum;                 /* MJ checksum value read from journal */
  u32 u;                     /* Unsigned loop counter */
  unsigned char aMagic[8];   /* A buffer to hold the magic header */
  zMaster[0] = '\0';

  if( SQLITE_OK!=(rc = sqlite3OsFileSize(pJrnl, &szJ))
   || szJ<16
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-16, &len))
   || len>=nMaster 
   || len>szJ-16
   || len==0 
   || SQLITE_OK!=(rc = read32bits(pJrnl, szJ-12, &cksum))
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, aMagic, 8, szJ-8))
   || memcmp(aMagic, aJournalMagic, 8)
   || SQLITE_OK!=(rc = sqlite3OsRead(pJrnl, zMaster, len, szJ-16-len))
  ){
    return rc;
  }

  /* See if the checksum matches the master journal name */
  for(u=0; u<len; u++){
    cksum -= zMaster[u];
  }
  if( cksum ){
    /* If the checksum doesn't add up, then one or more of the disk sectors
    ** containing the master journal filename is corrupted. This means
    ** definitely roll back, so just return SQLITE_OK and report a (nul)
    ** master-journal filename.
    */
    len = 0;
  }
  zMaster[len] = '\0';
   
  return SQLITE_OK;
}